

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

void print_chain(ip_chain_t *ipc)

{
  char *pcVar1;
  list_head *plVar2;
  
  printf("\tChain [%s]",ipc);
  if (ipc->policy == 6) {
    putchar(10);
  }
  else {
    pcVar1 = map_int_get_k(ipc->policy,m_target);
    printf(" (policy %s)\n",pcVar1);
  }
  plVar2 = &ipc->rules;
  while (plVar2 = plVar2->next, plVar2 != &ipc->rules) {
    printf("\t\t");
    print_rule((ip_rule_t *)(plVar2 + -5));
  }
  putchar(10);
  return;
}

Assistant:

static void print_chain(ip_chain_t *ipc)
{
	printf("\tChain [%s]", ipc->name);

	if (ipc->policy != TARGET_NONE) {
		printf(" (policy %s)\n", map_int_get_k(ipc->policy, m_target));
	} else {
		printf("\n");
	}

	ip_rule_t *p = NULL;
	list_for_each_entry(p, &ipc->rules, list) {
		printf("\t\t");
		print_rule(p);
	}
	printf("\n");
}